

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::detail::
arg_formatter_base<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_fmt::v6::detail::error_handler>
::write_decimal<long_long>
          (arg_formatter_base<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_fmt::v6::detail::error_handler>
           *this,longlong value)

{
  buffer<char> *pbVar1;
  size_t sVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  buffer<char> *c;
  
  uVar5 = -value;
  if (0 < value) {
    uVar5 = value;
  }
  lVar4 = 0x3f;
  if ((uVar5 | 1) != 0) {
    for (; (uVar5 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  uVar6 = ((uint)lVar4 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar7 = (ulong)((uVar6 - (uVar5 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 +
                                              (ulong)uVar6 * 8))) + 1);
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar9 = (sVar2 - (value >> 0x3f)) + uVar7;
  if (pbVar1->capacity_ < uVar9) {
    (**pbVar1->_vptr_buffer)(pbVar1,uVar9);
  }
  pcVar8 = pbVar1->ptr_ + sVar2;
  pbVar1->size_ = uVar9;
  if (value < 0) {
    *pcVar8 = '-';
    pcVar8 = pcVar8 + 1;
  }
  pcVar8 = pcVar8 + uVar7;
  uVar7 = uVar5;
  if (99 < uVar5) {
    do {
      uVar5 = uVar7 / 100;
      *(undefined2 *)(pcVar8 + -2) = *(undefined2 *)(basic_data<void>::digits + (uVar7 % 100) * 2);
      pcVar8 = pcVar8 + -2;
      bVar3 = 9999 < uVar7;
      uVar7 = uVar5;
    } while (bVar3);
  }
  if (uVar5 < 10) {
    pcVar8[-1] = (byte)uVar5 | 0x30;
  }
  else {
    *(undefined2 *)(pcVar8 + -2) = *(undefined2 *)(basic_data<void>::digits + uVar5 * 2);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }